

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O3

bool __thiscall TCLAP::SwitchArg::combinedSwitchesMatch(SwitchArg *this,string *combinedSwitches)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  short *local_80;
  long local_78;
  short local_70 [8];
  undefined2 *local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined1 local_4e;
  undefined2 *local_40;
  undefined8 local_38;
  undefined2 local_30;
  undefined1 local_2e;
  
  if ((combinedSwitches->_M_string_length == 0) || (*(combinedSwitches->_M_dataplus)._M_p == '-')) {
    local_50 = 0x2d2d;
    local_58 = 2;
    local_4e = 0;
    local_60 = &local_50;
    std::__cxx11::string::substr((ulong)&local_80,(ulong)combinedSwitches);
    local_40 = &local_30;
    local_30 = 0x2d2d;
    local_38 = 2;
    local_2e = 0;
    if (local_78 == 2) {
      bVar6 = *local_80 == 0x2d2d;
    }
    else {
      bVar6 = false;
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (!bVar6) {
      lVar3 = std::__cxx11::string::find
                        ((char)combinedSwitches,(ulong)(uint)(int)Arg::delimiterRef()::delim);
      if (lVar3 != -1) {
        return false;
      }
      if (1 < combinedSwitches->_M_string_length) {
        pcVar2 = (combinedSwitches->_M_dataplus)._M_p;
        uVar4 = 1;
        uVar5 = 2;
        do {
          if (((this->super_Arg)._flag._M_string_length != 0) &&
             (cVar1 = pcVar2[uVar4],
             cVar1 != '-' && cVar1 == *(this->super_Arg)._flag._M_dataplus._M_p)) {
            pcVar2[uVar4] = '\a';
            return true;
          }
          bVar6 = uVar5 < combinedSwitches->_M_string_length;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar6);
      }
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::combinedSwitchesMatch(std::string& combinedSwitches )
{
  // make sure this is actually a combined switch
  if ( combinedSwitches.length() > 0 &&
       combinedSwitches[0] != Arg::flagStartString()[0] )
    return false;

  // make sure it isn't a long name 
  if ( combinedSwitches.substr( 0, Arg::nameStartString().length() ) == 
       Arg::nameStartString() )
    return false;

  // make sure the delimiter isn't in the string 
  if ( combinedSwitches.find_first_of(Arg::delimiter()) != std::string::npos)
    return false;

  // ok, we're not specifying a ValueArg, so we know that we have
  // a combined switch list.  
  for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
    if ( _flag.length() > 0 && 
	 combinedSwitches[i] == _flag[0] &&
	 _flag[0] != Arg::flagStartString()[0] ) 
      {
	// update the combined switches so this one is no longer present
	// this is necessary so that no unlabeled args are matched
	// later in the processing.
	//combinedSwitches.erase(i,1);
	combinedSwitches[i] = Arg::blankChar(); 
	return true;
      }

  // none of the switches passed in the list match. 
  return false;   
}